

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void display_monster(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  uint8_t attr;
  uint8_t uVar1;
  wchar_t wVar2;
  monster_race *pmVar3;
  monster_lore *pmVar4;
  _Bool _Var5;
  undefined7 in_register_00000011;
  char *pcVar6;
  wchar_t c;
  uint8_t a;
  
  pmVar4 = l_list;
  pmVar3 = r_info;
  wVar2 = default_join[oid].oid;
  attr = curs_attrs[1][CONCAT71(in_register_00000011,cursor) & 0xffffffff];
  a = monster_x_attr[r_info[wVar2].ridx];
  if ((tile_height == '\x01') || (-1 < (char)a)) {
    c = monster_x_char[r_info[wVar2].ridx];
    if (((player->opts).opt[0x10] == true) && (uVar1 = a, -1 < (char)a)) goto LAB_001cb99e;
  }
  else {
    a = r_info[wVar2].d_attr;
    c = r_info[wVar2].d_char;
    uVar1 = a;
    if ((player->opts).opt[0x10] != false) {
LAB_001cb99e:
      _Var5 = flag_has_dbg(r_info[wVar2].flags,0xb,1,"race->flags","RF_UNIQUE");
      a = '\x11';
      if (!_Var5) {
        a = uVar1;
      }
    }
  }
  c_prt(attr,pmVar3[wVar2].name,row,col);
  big_pad(L'B',row,a,c);
  if (pmVar3[wVar2].rarity == L'\0') {
    pcVar6 = "shape";
  }
  else {
    _Var5 = flag_has_dbg(pmVar3[wVar2].flags,0xb,1,"race->flags","RF_UNIQUE");
    if (!_Var5) {
      pcVar6 = format("%5d",(ulong)pmVar4[wVar2].pkills);
      goto LAB_001cba73;
    }
    pcVar6 = "alive";
    if (pmVar3[wVar2].max_num == '\0') {
      pcVar6 = " dead";
    }
  }
  pcVar6 = format("%s",pcVar6);
LAB_001cba73:
  put_str(pcVar6,row,L'F');
  return;
}

Assistant:

static void display_monster(int col, int row, bool cursor, int oid)
{
	/* HACK Get the race index. (Should be a wrapper function) */
	int r_idx = default_item_id(oid);

	/* Access the race */
	struct monster_race *race = &r_info[r_idx];
	struct monster_lore *lore = &l_list[r_idx];

	/* Choose colors */
	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];
	uint8_t a = monster_x_attr[race->ridx];
	wchar_t c = monster_x_char[race->ridx];

	if ((tile_height != 1) && (a & 0x80)) {
		a = race->d_attr;
		c = race->d_char;
		/* If uniques are purple, make it so */
		if (OPT(player, purple_uniques) && rf_has(race->flags, RF_UNIQUE))
			a = COLOUR_VIOLET;
	}
	/* If uniques are purple, make it so */
	else if (OPT(player, purple_uniques) && !(a & 0x80) &&
			 rf_has(race->flags, RF_UNIQUE))
		a = COLOUR_VIOLET;

	/* Display the name */
	c_prt(attr, race->name, row, col);

	/* Display symbol */
	big_pad(66, row, a, c);

	/* Display kills */
	if (!race->rarity) {
		put_str(format("%s", "shape"), row, 70);
	} else if (rf_has(race->flags, RF_UNIQUE)) {
		put_str(format("%s", (race->max_num == 0)?  " dead" : "alive"),
				row, 70);
	} else {
		put_str(format("%5d", lore->pkills), row, 70);
	}
}